

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umsg.cpp
# Opt level: O2

int32_t umsg_toPattern_63(UMessageFormat *fmt,UChar *result,int32_t resultLength,UErrorCode *status)

{
  int32_t iVar1;
  Char16Ptr local_80;
  UChar *local_78;
  UnicodeString res;
  
  iVar1 = -1;
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((resultLength < 0 || fmt == (UMessageFormat *)0x0) ||
       (result == (UChar *)0x0 && resultLength != 0)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      res.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
      res.fUnion.fStackFields.fLengthAndFlags = 2;
      if (result != (UChar *)0x0 || resultLength != 0) {
        icu_63::UnicodeString::setTo(&res,result,0,resultLength);
      }
      (**(code **)((long)*fmt + 0x68))(fmt,&res);
      local_80.p_ = result;
      iVar1 = icu_63::UnicodeString::extract(&res,&local_80,resultLength,status);
      local_78 = local_80.p_;
      icu_63::UnicodeString::~UnicodeString(&res);
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
umsg_toPattern(const UMessageFormat *fmt,
               UChar* result, 
               int32_t resultLength,
               UErrorCode* status)
{
    //check arguments
    if(status ==NULL||U_FAILURE(*status)){
        return -1;
    }
    if(fmt==NULL||resultLength<0 || (resultLength>0 && result==0)){
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }


    UnicodeString res;
    if(!(result==NULL && resultLength==0)) {
        // NULL destination for pure preflighting: empty dummy string
        // otherwise, alias the destination buffer
        res.setTo(result, 0, resultLength);
    }
    ((const MessageFormat*)fmt)->toPattern(res);
    return res.extract(result, resultLength, *status);
}